

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzio.cpp
# Opt level: O3

int luaZ_lookahead(ZIO *z)

{
  int iVar1;
  byte *pbVar2;
  
  if (z->n == 0) {
    iVar1 = luaZ_fill(z);
    if (iVar1 == -1) {
      return -1;
    }
    z->n = z->n + 1;
    pbVar2 = (byte *)(z->p + -1);
    z->p = (char *)pbVar2;
  }
  else {
    pbVar2 = (byte *)z->p;
  }
  return (uint)*pbVar2;
}

Assistant:

int luaZ_lookahead (ZIO *z) {
  if (z->n == 0) {
    if (luaZ_fill(z) == EOZ)
      return EOZ;
    else {
      z->n++;  /* luaZ_fill removed first byte; put back it */
      z->p--;
    }
  }
  return char2int(*z->p);
}